

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

oonf_layer2_neighbor_address * oonf_layer2_net_get_best_neighbor_match(netaddr *addr)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  list_entity *plVar5;
  uint uVar6;
  list_entity *plVar7;
  list_entity *plVar8;
  oonf_layer2_neighbor_address *poVar9;
  
  if ((_oonf_layer2_net_tree.list_head.next)->prev == _oonf_layer2_net_tree.list_head.prev) {
    poVar9 = (oonf_layer2_neighbor_address *)0x0;
  }
  else {
    uVar6 = 0x100;
    poVar9 = (oonf_layer2_neighbor_address *)0x0;
    plVar5 = _oonf_layer2_net_tree.list_head.next;
    do {
      plVar8 = plVar5[-0x71].next;
      if (plVar8->prev != plVar5[-0x71].prev) {
        do {
          for (plVar7 = plVar8[-0x44].next; plVar7->prev != plVar8[-0x44].prev;
              plVar7 = plVar7->next) {
            cVar4 = netaddr_is_in_subnet((oonf_layer2_neighbor_address *)(plVar7 + -6),addr);
            if (cVar4 != '\0') {
              bVar1 = *(byte *)((long)&plVar7[-5].next + 1);
              uVar3 = uVar6;
              if (bVar1 <= uVar6) {
                uVar3 = (uint)bVar1;
              }
              bVar2 = bVar1 < uVar6;
              uVar6 = uVar3;
              if (bVar2) {
                poVar9 = (oonf_layer2_neighbor_address *)(plVar7 + -6);
              }
            }
          }
          plVar8 = plVar8->next;
        } while (plVar8->prev != plVar5[-0x71].prev);
      }
      plVar5 = plVar5->next;
    } while (plVar5->prev != _oonf_layer2_net_tree.list_head.prev);
  }
  return poVar9;
}

Assistant:

struct oonf_layer2_neighbor_address *
oonf_layer2_net_get_best_neighbor_match(const struct netaddr *addr) {
  struct oonf_layer2_neighbor_address *best_match, *l2addr;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
  int prefix_length;

  prefix_length = 256;
  best_match = NULL;

  avl_for_each_element(&_oonf_layer2_net_tree, l2net, _node) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      avl_for_each_element(&l2neigh->remote_neighbor_ips, l2addr, _neigh_node) {
        if (netaddr_is_in_subnet(&l2addr->ip, addr) && netaddr_get_prefix_length(&l2addr->ip) < prefix_length) {
          best_match = l2addr;
          prefix_length = netaddr_get_prefix_length(&l2addr->ip);
        }
      }
    }
  }
  return best_match;
}